

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpvector.hpp
# Opt level: O1

QpVector * __thiscall QpVector::operator+=(QpVector *this,QpVector *other)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  long lVar6;
  
  iVar1 = other->num_nz;
  if (0 < (long)iVar1) {
    piVar3 = (other->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (other->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      iVar2 = piVar3[lVar6];
      pdVar5[iVar2] = pdVar4[iVar2] + pdVar5[iVar2];
      lVar6 = lVar6 + 1;
    } while (iVar1 != lVar6);
  }
  resparsify(this);
  return this;
}

Assistant:

QpVector& operator+=(const QpVector& other) {
    // sanitize();
    for (HighsInt i = 0; i < other.num_nz; i++) {
      // if (value[other.index[i]] == 0.0) {
      //    index[num_nz++] = other.index[i];
      // }
      value[other.index[i]] += other.value[other.index[i]];
    }
    resparsify();
    return *this;
  }